

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O1

void helper_crypto_sm3partw2_aarch64(void *vd,void *vn,void *vm)

{
  ulong uVar1;
  uint uVar2;
  uint64_t *rm;
  uint uVar3;
  uint64_t *rn;
  uint uVar4;
  uint uVar5;
  
  uVar2 = (uint)*vm;
  uVar2 = (uVar2 << 7 | uVar2 >> 0x19) ^ (uint)*vn;
  uVar4 = (uint)((ulong)*vm >> 0x20);
  uVar5 = (uint)*(undefined8 *)((long)vm + 8);
  uVar1 = *(ulong *)((long)vn + 8) ^ *(ulong *)((long)vd + 8);
  uVar3 = (uint)((ulong)*(undefined8 *)((long)vm + 8) >> 0x20);
  *(ulong *)vd = CONCAT44((uint)((ulong)*vn >> 0x20) ^ (uint)((ulong)*vd >> 0x20) ^
                          (uVar4 << 7 | uVar4 >> 0x19),(uint)*vd ^ uVar2);
  *(ulong *)((long)vd + 8) =
       CONCAT44((uint)(uVar1 >> 0x20) ^ (uVar3 << 7 | uVar3 >> 0x19) ^
                (uVar2 << 0xf | uVar2 >> 0x11) ^
                (uVar2 << 6 | uVar2 >> 0x1a) ^ (uVar2 << 0x1e | uVar2 >> 2),
                (uint)uVar1 ^ (uVar5 << 7 | uVar5 >> 0x19));
  return;
}

Assistant:

void HELPER(crypto_sm3partw2)(void *vd, void *vn, void *vm)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE n = { .l = { rn[0], rn[1] } };
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };
    uint32_t t = CR_ST_WORD(n, 0) ^ ror32(CR_ST_WORD(m, 0), 25);

    CR_ST_WORD(d, 0) ^= t;
    CR_ST_WORD(d, 1) ^= CR_ST_WORD(n, 1) ^ ror32(CR_ST_WORD(m, 1), 25);
    CR_ST_WORD(d, 2) ^= CR_ST_WORD(n, 2) ^ ror32(CR_ST_WORD(m, 2), 25);
    CR_ST_WORD(d, 3) ^= CR_ST_WORD(n, 3) ^ ror32(CR_ST_WORD(m, 3), 25) ^
                        ror32(t, 17) ^ ror32(t, 2) ^ ror32(t, 26);

    rd[0] = d.l[0];
    rd[1] = d.l[1];
}